

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::updateStandaloneQualifierDefaults
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  EShLanguage EVar1;
  TLayoutGeometry TVar2;
  TLayoutGeometry TVar3;
  TVertexSpacing TVar4;
  TVertexSpacing TVar5;
  TVertexOrder TVar6;
  TVertexOrder TVar7;
  TInterlockOrdering TVar8;
  TInterlockOrdering TVar9;
  TIntermediate *pTVar10;
  pointer pTVar11;
  char cVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int *piVar22;
  long lVar23;
  uint uVar24;
  char *pcVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar26;
  char *pcVar27;
  uint uVar28;
  char *pcVar29;
  _func_int **pp_Var30;
  long lVar31;
  TString maxsErrtring;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  iVar15 = (publicType->shaderQualifiers).vertices;
  if (iVar15 != -1) {
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    if ((EShLangMesh < EVar1) || ((0x200aU >> (EVar1 & 0x1f) & 1) == 0)) {
      __assert_fail("language == EShLangTessControl || language == EShLangGeometry || language == EShLangMesh"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x2743,
                    "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
    pcVar27 = "max_vertices";
    if (EVar1 == EShLangTessControl) {
      pcVar27 = "vertices";
    }
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'out\'",pcVar27,"");
      iVar15 = (publicType->shaderQualifiers).vertices;
    }
    pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar14 = pTVar10->vertices;
    if (iVar14 == -1) {
      pTVar10->vertices = iVar15;
    }
    else if (iVar14 != iVar15) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value",pcVar27,"");
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
      checkIoArraysConsistency(this,loc,false);
    }
  }
  iVar15 = (publicType->shaderQualifiers).primitives;
  if (iVar15 != -1) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      __assert_fail("language == EShLangMesh",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x274f,
                    "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'out\'","max_primitives","");
      iVar15 = (publicType->shaderQualifiers).primitives;
    }
    pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar14 = pTVar10->primitives;
    if (iVar14 == -1) {
      pTVar10->primitives = iVar15;
    }
    else if (iVar14 != iVar15) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","max_primitives","");
    }
  }
  iVar15 = (publicType->shaderQualifiers).invocations;
  if (iVar15 != -1) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","invocations","");
      iVar15 = (publicType->shaderQualifiers).invocations;
    }
    pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar14 = pTVar10->invocations;
    if (iVar14 == -1) {
      pTVar10->invocations = iVar15;
    }
    else if (iVar14 != iVar15) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","invocations","");
    }
  }
  TVar2 = (publicType->shaderQualifiers).geometry;
  lVar16 = (long)(int)TVar2;
  if (lVar16 == 0) goto LAB_004be18a;
  uVar24 = (uint)*(undefined8 *)&(publicType->qualifier).field_0x8;
  uVar28 = uVar24 & 0x7f;
  if (uVar28 != 4) {
    if (uVar28 == 3) {
      if (TVar2 < (ElgQuads|ElgLines)) {
        if ((0x36eU >> (TVar2 & 0x1f) & 1) == 0) {
          if (TVar2 == ElgLineStrip) {
            pcVar27 = "line_strip";
          }
          else {
            if (TVar2 != ElgTriangleStrip) goto LAB_004be162;
            pcVar27 = "triangle_strip";
          }
          goto LAB_004be169;
        }
        EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
        if (EVar1 == EShLangMesh) {
          pcVar27 = *(char **)(&DAT_00afdb88 + lVar16 * 8);
          goto LAB_004be169;
        }
        pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar3 = pTVar10->inputPrimitive;
        if (TVar3 == ElgNone) {
          pTVar10->inputPrimitive = TVar2;
LAB_004be0f8:
          if (EVar1 == EShLangGeometry) {
            checkIoArraysConsistency(this,loc,false);
          }
          goto LAB_004be18a;
        }
        if (TVar3 == TVar2) goto LAB_004be0f8;
        pcVar27 = *(char **)(&DAT_00afdb88 + lVar16 * 8);
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar25 = "cannot change previously set input primitive";
      }
      else {
LAB_004be162:
        pcVar27 = "none";
LAB_004be169:
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar25 = "cannot apply to input";
      }
      goto LAB_004be173;
    }
    if (TVar2 < (ElgQuads|ElgLines)) {
      pcVar27 = *(char **)(&DAT_00afdb88 + lVar16 * 8);
    }
    else {
      pcVar27 = "none";
    }
    if (uVar28 < 0x1f) {
      pcVar29 = (&PTR_anon_var_dwarf_1065203_00afdbd8)[uVar24 & 0x7f];
    }
    else {
      pcVar29 = "unknown qualifier";
    }
    pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar25 = "cannot apply to:";
    goto LAB_004be17a;
  }
  switch(TVar2) {
  case ElgPoints:
  case ElgLineStrip:
  case ElgTriangleStrip:
    goto switchD_004be016_caseD_1;
  case ElgLines:
  case ElgTriangles:
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      pcVar27 = &DAT_00889fa8 + *(int *)(&DAT_00889fa0 + lVar16 * 4);
      break;
    }
switchD_004be016_caseD_1:
    pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar3 = pTVar10->outputPrimitive;
    if (TVar3 != ElgNone) {
      if (TVar3 == TVar2) goto LAB_004be18a;
      pcVar27 = &DAT_00889fb8 + *(int *)(&DAT_00889fb4 + lVar16 * 4);
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar25 = "cannot change previously set output primitive";
      goto LAB_004be173;
    }
    pTVar10->outputPrimitive = TVar2;
    goto LAB_004be18a;
  case ElgLinesAdjacency:
    pcVar27 = "lines_adjacency";
    break;
  case ElgTrianglesAdjacency:
    pcVar27 = "triangles_adjacency";
    break;
  case ElgQuads:
    pcVar27 = "quads";
    break;
  case ElgIsolines:
    pcVar27 = "isolines";
    break;
  default:
    pcVar27 = "none";
  }
  pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar25 = "cannot apply to \'out\'";
LAB_004be173:
  pcVar29 = "";
LAB_004be17a:
  (*pp_Var30[0x2d])(this,loc,pcVar25,pcVar27,pcVar29);
LAB_004be18a:
  TVar4 = (publicType->shaderQualifiers).spacing;
  lVar16 = (long)(int)TVar4;
  if (lVar16 != 0) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = pTVar10->vertexSpacing;
      if (TVar5 == EvsNone) {
        pTVar10->vertexSpacing = TVar4;
      }
      else if (TVar5 != TVar4) {
        if (TVar4 < 4) {
          pcVar27 = *(char **)(&DAT_00afdcc8 + lVar16 * 8);
        }
        else {
          pcVar27 = "none";
        }
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar25 = "cannot change previously set vertex spacing";
        goto LAB_004be207;
      }
    }
    else {
      if (TVar4 < 4) {
        pcVar27 = *(char **)(&DAT_00afdcc8 + lVar16 * 8);
      }
      else {
        pcVar27 = "none";
      }
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar25 = "can only apply to \'in\'";
LAB_004be207:
      (*pp_Var30[0x2d])(this,loc,pcVar25,pcVar27,"");
    }
  }
  TVar6 = (publicType->shaderQualifiers).order;
  if (TVar6 != EvoNone) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar7 = pTVar10->vertexOrder;
      if (TVar7 == EvoNone) {
        pTVar10->vertexOrder = TVar6;
      }
      else if (TVar7 != TVar6) {
        pcVar27 = "none";
        if (TVar6 == EvoCcw) {
          pcVar27 = "ccw";
        }
        pcVar25 = "cw";
        if (TVar6 != EvoCw) {
          pcVar25 = pcVar27;
        }
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar27 = "cannot change previously set vertex order";
        goto LAB_004be2a4;
      }
    }
    else {
      pcVar27 = "none";
      if (TVar6 == EvoCcw) {
        pcVar27 = "ccw";
      }
      pcVar25 = "cw";
      if (TVar6 != EvoCw) {
        pcVar25 = pcVar27;
      }
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar27 = "can only apply to \'in\'";
LAB_004be2a4:
      (*pp_Var30[0x2d])(this,loc,pcVar27,pcVar25,"");
    }
  }
  if ((publicType->shaderQualifiers).pointMode == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->pointMode = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","point_mode","");
    }
  }
  lVar31 = 8;
  lVar16 = 0;
  do {
    if ((publicType->shaderQualifiers).localSizeNotDefault[lVar16] == true) {
      if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
        pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        uVar24 = (publicType->shaderQualifiers).localSize[lVar16];
        if (pTVar10->localSizeNotDefault[lVar16] == false) {
          pTVar10->localSizeNotDefault[lVar16] = true;
          pTVar10->localSize[lVar16] = uVar24;
        }
        else if (pTVar10->localSize[lVar16] != uVar24) {
          pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar27 = "cannot change previously set size";
          goto LAB_004be3a0;
        }
        EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
        iVar15 = (int)lVar16;
        if (EVar1 == EShLangMesh) {
          iVar14 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                             (this,"GL_EXT_mesh_shader");
          if (iVar15 == 2) {
            lVar18 = 0x72c;
            lVar23 = 0x750;
          }
          else if (iVar15 == 1) {
            lVar18 = 0x728;
            lVar23 = 0x74c;
          }
          else {
            lVar18 = 0x724;
            lVar23 = 0x748;
          }
          if ((char)iVar14 != '\0') {
            lVar18 = lVar23;
          }
          if (*(uint *)((long)&(this->super_TParseContextBase).super_TParseVersions.
                               _vptr_TParseVersions + lVar18) <
              (uint)((this->super_TParseContextBase).super_TParseVersions.intermediate)->localSize
                    [lVar16]) {
            local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_58,"too large, see ","");
            iVar15 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                               (this,"GL_EXT_mesh_shader");
            cVar12 = (char)iVar15;
            pcVar27 = "gl_MaxMeshWorkGroupSizeNV";
            pcVar25 = "gl_MaxMeshWorkGroupSizeEXT";
LAB_004be57a:
            if (cVar12 != '\0') {
              pcVar27 = pcVar25;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&local_58,pcVar27);
            pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                       *)local_58._M_dataplus._M_p;
LAB_004be59f:
            (*pp_Var30[0x2d])(this,loc,paVar26,"local_size","");
          }
        }
        else if (EVar1 == EShLangTask) {
          iVar14 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                             (this,"GL_EXT_mesh_shader");
          if (iVar15 == 2) {
            lVar18 = 0x738;
            lVar23 = 0x75c;
          }
          else if (iVar15 == 1) {
            lVar18 = 0x734;
            lVar23 = 0x758;
          }
          else {
            lVar18 = 0x730;
            lVar23 = 0x754;
          }
          if ((char)iVar14 != '\0') {
            lVar18 = lVar23;
          }
          if (*(uint *)((long)&(this->super_TParseContextBase).super_TParseVersions.
                               _vptr_TParseVersions + lVar18) <
              (uint)((this->super_TParseContextBase).super_TParseVersions.intermediate)->localSize
                    [lVar16]) {
            local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_58,"too large, see ","");
            iVar15 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                               (this,"GL_EXT_mesh_shader");
            cVar12 = (char)iVar15;
            pcVar27 = "gl_MaxTaskWorkGroupSizeNV";
            pcVar25 = "gl_MaxTaskWorkGroupSizeEXT";
            goto LAB_004be57a;
          }
        }
        else {
          if (EVar1 != EShLangCompute) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x27e1,
                          "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                         );
          }
          piVar22 = &(this->resources).maxComputeWorkGroupSizeX;
          if ((iVar15 != 0) && (piVar22 = &(this->resources).maxComputeWorkGroupSizeZ, iVar15 != 2))
          {
            piVar22 = &(this->resources).maxComputeWorkGroupSizeY;
          }
          if ((uint)*piVar22 < uVar24) {
            pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                       *)"too large; see gl_MaxComputeWorkGroupSize";
            goto LAB_004be59f;
          }
        }
        iVar15 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                           (this,"gl_WorkGroupSize");
        plVar17 = (long *)CONCAT44(extraout_var,iVar15);
        if (plVar17 != (long *)0x0) {
          lVar18 = (**(code **)(*plVar17 + 0xc0))(plVar17);
          lVar18 = *(long *)(*(long *)(lVar18 + 8) + 8);
          *(int *)(lVar18 + -8 + lVar31) =
               ((this->super_TParseContextBase).super_TParseVersions.intermediate)->localSize
               [lVar16];
          *(undefined4 *)(lVar18 + lVar31) = 9;
        }
      }
      else {
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar27 = "can only apply to \'in\'";
LAB_004be3a0:
        (*pp_Var30[0x2d])(this,loc,pcVar27,"local_size","");
      }
    }
    iVar15 = (publicType->shaderQualifiers).localSizeSpecId[lVar16];
    if (iVar15 != -1) {
      if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
        pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar14 = pTVar10->localSizeSpecId[lVar16];
        if (iVar14 == -1) {
          pTVar10->localSizeSpecId[lVar16] = iVar15;
        }
        else if (iVar14 != iVar15) {
          pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar25 = "cannot change previously set size";
          pcVar27 = "local_size";
          goto LAB_004be655;
        }
      }
      else {
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar25 = "can only apply to \'in\'";
        pcVar27 = "local_size id";
LAB_004be655:
        (*pp_Var30[0x2d])(this,loc,pcVar25,pcVar27,"");
      }
      iVar15 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                         (this,"gl_WorkGroupSize");
      plVar17 = (long *)CONCAT44(extraout_var_00,iVar15);
      if (plVar17 != (long *)0x0) {
        plVar17 = (long *)(**(code **)(*plVar17 + 0x68))(plVar17);
        lVar18 = (**(code **)(*plVar17 + 0x50))(plVar17);
        *(byte *)(lVar18 + 0xc) = *(byte *)(lVar18 + 0xc) | 1;
      }
    }
    lVar16 = lVar16 + 1;
    lVar31 = lVar31 + 0x10;
  } while (lVar16 != 3);
  if ((publicType->shaderQualifiers).earlyFragmentTests != false) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->earlyFragmentTests = true
      ;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","early_fragment_tests","");
    }
  }
  if ((publicType->shaderQualifiers).earlyAndLateFragmentTestsAMD == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      earlyAndLateFragmentTestsAMD = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","early_and_late_fragment_tests_amd","");
    }
  }
  if ((publicType->shaderQualifiers).postDepthCoverage == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->postDepthCoverage = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","post_coverage_coverage","");
    }
  }
  if ((publicType->shaderQualifiers).nonCoherentColorAttachmentReadEXT == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      nonCoherentColorAttachmentReadEXT = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_color_attachment_readEXT","");
    }
  }
  if ((publicType->shaderQualifiers).nonCoherentDepthAttachmentReadEXT == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      nonCoherentDepthAttachmentReadEXT = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_depth_attachment_readEXT","");
    }
  }
  if ((publicType->shaderQualifiers).nonCoherentStencilAttachmentReadEXT == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      nonCoherentStencilAttachmentReadEXT = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_stencil_attachment_readEXT","");
    }
  }
  if (((publicType->shaderQualifiers).blendEquation == true) &&
     ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 4)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to \'out\'","blend equation","");
  }
  TVar8 = (publicType->shaderQualifiers).interlockOrdering;
  lVar16 = (long)(int)TVar8;
  if (lVar16 != 0) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar9 = pTVar10->interlockOrdering;
      if (TVar9 == EioNone) {
        pTVar10->interlockOrdering = TVar8;
      }
      else if (TVar9 != TVar8) {
        if (TVar8 < EioCount) {
          pcVar27 = *(char **)(&DAT_00afdce0 + lVar16 * 8);
        }
        else {
          pcVar27 = "none";
        }
        pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar25 = "cannot change previously set fragment shader interlock ordering";
        goto LAB_004be925;
      }
    }
    else {
      if (TVar8 < EioCount) {
        pcVar27 = *(char **)(&DAT_00afdce0 + lVar16 * 8);
      }
      else {
        pcVar27 = "none";
      }
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar25 = "can only apply to \'in\'";
LAB_004be925:
      (*pp_Var30[0x2d])(this,loc,pcVar25,pcVar27,"");
    }
  }
  bVar13 = (publicType->shaderQualifiers).layoutDerivativeGroupQuads;
  if (((bool)bVar13 == true) && ((publicType->shaderQualifiers).layoutDerivativeGroupLinear == true)
     ) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot be both specified",
               "derivative_group_quadsNV and derivative_group_linearNV","");
    bVar13 = (publicType->shaderQualifiers).layoutDerivativeGroupQuads;
  }
  if ((bVar13 & 1) != 0) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (((pTVar10->localSizeSpecId[0] != -1) || ((pTVar10->localSize[0] & 1) == 0)) &&
         ((pTVar10->localSizeSpecId[1] != -1 || ((pTVar10->localSize[1] & 1) == 0)))) {
        pTVar10->computeDerivativeMode = LayoutDerivativeGroupQuads;
        goto LAB_004be9f8;
      }
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar27 = "requires local_size_x and local_size_y to be multiple of two";
    }
    else {
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar27 = "can only apply to \'in\'";
    }
    (*pp_Var30[0x2d])(this,loc,pcVar27,"derivative_group_quadsNV","");
  }
LAB_004be9f8:
  if ((publicType->shaderQualifiers).layoutDerivativeGroupLinear == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((((pTVar10->localSizeSpecId[0] != -1) || (pTVar10->localSizeSpecId[1] != -1)) ||
          (pTVar10->localSizeSpecId[2] != -1)) ||
         ((pTVar10->localSize[1] * pTVar10->localSize[0] * pTVar10->localSize[2] & 3U) == 0)) {
        pTVar10->computeDerivativeMode = LayoutDerivativeGroupLinear;
        goto LAB_004bea65;
      }
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar27 = "requires total group size to be multiple of four";
    }
    else {
      pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar27 = "can only apply to \'in\'";
    }
    (*pp_Var30[0x2d])(this,loc,pcVar27,"derivative_group_linearNV","");
  }
LAB_004bea65:
  if ((((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) &&
      (pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
      pTVar10->vertices != -1)) &&
     ((pTVar10->primitives != -1 && (pTVar10->outputPrimitive != ElgNone)))) {
    checkIoArraysConsistency(this,loc,false);
  }
  if ((publicType->shaderQualifiers).layoutPrimitiveCulling == true) {
    if (((publicType->qualifier).field_0x8 & 0x7f) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"layout qualifier cannot have storage qualifiers","primitive_culling","",
                 "");
      return;
    }
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->layoutPrimitiveCulling =
         true;
    return;
  }
  if ((*(ulong *)&(publicType->qualifier).field_0x8 & 0x3fff1e0ee000000) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "cannot use auxiliary, memory, interpolation, or precision qualifier in a default qualifier declaration (declaration with no type)"
               ,"qualifier","");
  }
  if (((publicType->qualifier).layoutOffset != -1) || ((publicType->qualifier).layoutAlign != -1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "cannot use offset or align qualifiers in a default qualifier declaration (declaration with no type)"
               ,"layout qualifier","");
  }
  layoutQualifierCheck(this,loc,&publicType->qualifier);
  uVar20 = *(ulong *)&(publicType->qualifier).field_0x8;
  switch((uint)uVar20 & 0x7f) {
  case 3:
    break;
  case 4:
    uVar20 = *(ulong *)&(publicType->qualifier).field_0x1c;
    if ((char)(uVar20 >> 0x38) != -1) {
      *(ulong *)&(this->globalOutputDefaults).field_0x1c =
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xffffffffffffff |
           uVar20 & 0xff00000000000000;
    }
    uVar19 = (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf);
    uVar20 = *(ulong *)&(this->globalOutputDefaults).field_0x24;
    if (uVar19 == 0xf) {
      uVar19 = (ulong)((uint)uVar20 & 0xf);
      if (uVar19 == 0xf) break;
    }
    else {
      *(ulong *)&(this->globalOutputDefaults).field_0x24 = uVar20 & 0xfffffffffffffff0 | uVar19;
    }
    uVar20 = *(ulong *)&(publicType->qualifier).field_0x24;
    uVar24 = (uint)uVar20;
    if ((~uVar24 & 0x3fff0) != 0) {
      uVar21 = (uint)(uVar20 >> 4) & 0x3fff;
      pTVar11 = (((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbBuffers).
                super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar28 = pTVar11[uVar19].stride;
      if (uVar28 == 0x3fff) {
        pTVar11[uVar19].stride = uVar21;
      }
      else if (uVar28 != uVar21) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                   (ulong)(uVar24 & 0xf));
      }
    }
    break;
  case 5:
    if (uVar20 >> 0x3d != 0) {
      *(ulong *)&(this->globalUniformDefaults).field_0x8 =
           *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar20 & 0xe000000000000000;
    }
    bVar13 = (publicType->qualifier).field_0x10 & 0xf;
    if (bVar13 != 0) {
      (this->globalUniformDefaults).field_0x10 =
           (this->globalUniformDefaults).field_0x10 & 0xf0 | bVar13;
    }
    break;
  case 6:
    if (uVar20 >> 0x3d != 0) {
      *(ulong *)&(this->globalBufferDefaults).field_0x8 =
           *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar20 & 0xe000000000000000;
    }
    bVar13 = (publicType->qualifier).field_0x10 & 0xf;
    if (bVar13 != 0) {
      (this->globalBufferDefaults).field_0x10 =
           (this->globalBufferDefaults).field_0x10 & 0xf0 | bVar13;
    }
    break;
  case 7:
    if (uVar20 >> 0x3d != 0) {
      *(ulong *)&(this->globalSharedDefaults).field_0x8 =
           *(ulong *)&(this->globalSharedDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar20 & 0xe000000000000000;
    }
    bVar13 = (publicType->qualifier).field_0x10 & 0xf;
    if (bVar13 != 0) {
      (this->globalSharedDefaults).field_0x10 =
           (this->globalSharedDefaults).field_0x10 & 0xf0 | bVar13;
    }
    break;
  default:
    pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar25 = 
    "default qualifier requires \'uniform\', \'buffer\', \'in\', \'out\' or \'shared\' storage qualification"
    ;
    pcVar27 = "";
    goto LAB_004bef11;
  }
  uVar20 = *(ulong *)&(publicType->qualifier).field_0x1c;
  if ((short)(uVar20 >> 0x20) != -1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, include a type or full declaration","binding","")
    ;
    uVar20 = *(ulong *)&(publicType->qualifier).field_0x1c;
  }
  if ((uVar20 & 0xff000000007fff) != 0xff000000004fff) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, use a full declaration",
               "location/component/index","");
  }
  if ((~*(uint *)&(publicType->qualifier).field_0x24 & 0x7ffc0000) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, use a full declaration","xfb_offset","");
  }
  if ((publicType->qualifier).layoutPushConstant == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, can only be used on a block","push_constant","");
  }
  if ((publicType->qualifier).layoutBufferReference == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, can only be used on a block","buffer_reference",
               "");
  }
  if ((~*(ulong *)&(publicType->qualifier).field_0x24 & 0x7ff0000000000) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, can only be used on a scalar","constant_id","");
  }
  if ((publicType->qualifier).layoutShaderRecord == true) {
    pp_Var30 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar25 = "cannot declare a default, can only be used on a block";
    pcVar27 = "shaderRecordNV";
LAB_004bef11:
    (*pp_Var30[0x2d])(this,loc,pcVar25,pcVar27,"");
  }
  return;
}

Assistant:

void TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        assert(language == EShLangTessControl || language == EShLangGeometry || language == EShLangMesh);
        const char* id = (language == EShLangTessControl) ? "vertices" : "max_vertices";

        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", id, "");
        if (! intermediate.setVertices(publicType.shaderQualifiers.vertices))
            error(loc, "cannot change previously set layout value", id, "");

        if (language == EShLangTessControl)
            checkIoArraysConsistency(loc);
    }
    if (publicType.shaderQualifiers.primitives != TQualifier::layoutNotSet) {
        assert(language == EShLangMesh);
        const char* id = "max_primitives";

        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", id, "");
        if (! intermediate.setPrimitives(publicType.shaderQualifiers.primitives))
            error(loc, "cannot change previously set layout value", id, "");
    }
    if (publicType.shaderQualifiers.invocations != TQualifier::layoutNotSet) {
        if (publicType.qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to 'in'", "invocations", "");
        if (! intermediate.setInvocations(publicType.shaderQualifiers.invocations))
            error(loc, "cannot change previously set layout value", "invocations", "");
    }
    if (publicType.shaderQualifiers.geometry != ElgNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgPoints:
            case ElgLines:
            case ElgLinesAdjacency:
            case ElgTriangles:
            case ElgTrianglesAdjacency:
            case ElgQuads:
            case ElgIsolines:
                if (language == EShLangMesh) {
                    error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                    break;
                }
                if (intermediate.setInputPrimitive(publicType.shaderQualifiers.geometry)) {
                    if (language == EShLangGeometry)
                        checkIoArraysConsistency(loc);
                } else
                    error(loc, "cannot change previously set input primitive", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                break;
            default:
                error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
            }
        } else if (publicType.qualifier.storage == EvqVaryingOut) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgLines:
            case ElgTriangles:
                if (language != EShLangMesh) {
                    error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                    break;
                }
                [[fallthrough]];
            case ElgPoints:
            case ElgLineStrip:
            case ElgTriangleStrip:
                if (! intermediate.setOutputPrimitive(publicType.shaderQualifiers.geometry))
                    error(loc, "cannot change previously set output primitive", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                break;
            default:
                error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
            }
        } else
            error(loc, "cannot apply to:", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), GetStorageQualifierString(publicType.qualifier.storage));
    }
    if (publicType.shaderQualifiers.spacing != EvsNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (! intermediate.setVertexSpacing(publicType.shaderQualifiers.spacing))
                error(loc, "cannot change previously set vertex spacing", TQualifier::getVertexSpacingString(publicType.shaderQualifiers.spacing), "");
        } else
            error(loc, "can only apply to 'in'", TQualifier::getVertexSpacingString(publicType.shaderQualifiers.spacing), "");
    }
    if (publicType.shaderQualifiers.order != EvoNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (! intermediate.setVertexOrder(publicType.shaderQualifiers.order))
                error(loc, "cannot change previously set vertex order", TQualifier::getVertexOrderString(publicType.shaderQualifiers.order), "");
        } else
            error(loc, "can only apply to 'in'", TQualifier::getVertexOrderString(publicType.shaderQualifiers.order), "");
    }
    if (publicType.shaderQualifiers.pointMode) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setPointMode();
        else
            error(loc, "can only apply to 'in'", "point_mode", "");
    }

    for (int i = 0; i < 3; ++i) {
        if (publicType.shaderQualifiers.localSizeNotDefault[i]) {
            if (publicType.qualifier.storage == EvqVaryingIn) {
                if (! intermediate.setLocalSize(i, publicType.shaderQualifiers.localSize[i]))
                    error(loc, "cannot change previously set size", "local_size", "");
                else {
                    int max = 0;
                    if (language == EShLangCompute) {
                        switch (i) {
                        case 0: max = resources.maxComputeWorkGroupSizeX; break;
                        case 1: max = resources.maxComputeWorkGroupSizeY; break;
                        case 2: max = resources.maxComputeWorkGroupSizeZ; break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max)
                            error(loc, "too large; see gl_MaxComputeWorkGroupSize", "local_size", "");
                    } else if (language == EShLangMesh) {
                        switch (i) {
                        case 0:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeX_EXT :
                                    resources.maxMeshWorkGroupSizeX_NV;
                            break;
                        case 1:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeY_EXT :
                                    resources.maxMeshWorkGroupSizeY_NV ;
                            break;
                        case 2:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeZ_EXT :
                                    resources.maxMeshWorkGroupSizeZ_NV ;
                            break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max) {
                            TString maxsErrtring = "too large, see ";
                            maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                                    "gl_MaxMeshWorkGroupSizeEXT" : "gl_MaxMeshWorkGroupSizeNV");
                            error(loc, maxsErrtring.c_str(), "local_size", "");
                        }
                    } else if (language == EShLangTask) {
                        switch (i) {
                        case 0:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeX_EXT :
                                    resources.maxTaskWorkGroupSizeX_NV;
                            break;
                        case 1:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeY_EXT:
                                    resources.maxTaskWorkGroupSizeY_NV;
                            break;
                        case 2:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeZ_EXT:
                                    resources.maxTaskWorkGroupSizeZ_NV;
                            break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max) {
                            TString maxsErrtring = "too large, see ";
                            maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                                    "gl_MaxTaskWorkGroupSizeEXT" : "gl_MaxTaskWorkGroupSizeNV");
                            error(loc, maxsErrtring.c_str(), "local_size", "");
                        }
                    } else {
                        assert(0);
                    }

                    // Fix the existing constant gl_WorkGroupSize with this new information.
                    TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
                    if (workGroupSize != nullptr)
                        workGroupSize->getWritableConstArray()[i].setUConst(intermediate.getLocalSize(i));
                }
            } else
                error(loc, "can only apply to 'in'", "local_size", "");
        }
        if (publicType.shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet) {
            if (publicType.qualifier.storage == EvqVaryingIn) {
                if (! intermediate.setLocalSizeSpecId(i, publicType.shaderQualifiers.localSizeSpecId[i]))
                    error(loc, "cannot change previously set size", "local_size", "");
            } else
                error(loc, "can only apply to 'in'", "local_size id", "");
            // Set the workgroup built-in variable as a specialization constant
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            if (workGroupSize != nullptr)
                workGroupSize->getWritableType().getQualifier().specConstant = true;
        }
    }

    if (publicType.shaderQualifiers.earlyFragmentTests) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setEarlyFragmentTests();
        else
            error(loc, "can only apply to 'in'", "early_fragment_tests", "");
    }
    if (publicType.shaderQualifiers.earlyAndLateFragmentTestsAMD) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setEarlyAndLateFragmentTestsAMD();
        else
            error(loc, "can only apply to 'in'", "early_and_late_fragment_tests_amd", "");
    }
    if (publicType.shaderQualifiers.postDepthCoverage) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setPostDepthCoverage();
        else
            error(loc, "can only apply to 'in'", "post_coverage_coverage", "");
    }
    if (publicType.shaderQualifiers.nonCoherentColorAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentColorAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_color_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.nonCoherentDepthAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentDepthAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_depth_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.nonCoherentStencilAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentStencilAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_stencil_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.hasBlendEquation()) {
        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", "blend equation", "");
    }
    if (publicType.shaderQualifiers.interlockOrdering) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (!intermediate.setInterlockOrdering(publicType.shaderQualifiers.interlockOrdering))
                error(loc, "cannot change previously set fragment shader interlock ordering", TQualifier::getInterlockOrderingString(publicType.shaderQualifiers.interlockOrdering), "");
        }
        else
            error(loc, "can only apply to 'in'", TQualifier::getInterlockOrderingString(publicType.shaderQualifiers.interlockOrdering), "");
    }

    if (publicType.shaderQualifiers.layoutDerivativeGroupQuads &&
        publicType.shaderQualifiers.layoutDerivativeGroupLinear) {
        error(loc, "cannot be both specified", "derivative_group_quadsNV and derivative_group_linearNV", "");
    }

    if (publicType.shaderQualifiers.layoutDerivativeGroupQuads) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if ((intermediate.getLocalSizeSpecId(0) == TQualifier::layoutNotSet && (intermediate.getLocalSize(0) & 1)) ||
                (intermediate.getLocalSizeSpecId(1) == TQualifier::layoutNotSet && (intermediate.getLocalSize(1) & 1)))
                error(loc, "requires local_size_x and local_size_y to be multiple of two", "derivative_group_quadsNV", "");
            else
                intermediate.setLayoutDerivativeMode(LayoutDerivativeGroupQuads);
        }
        else
            error(loc, "can only apply to 'in'", "derivative_group_quadsNV", "");
    }
    if (publicType.shaderQualifiers.layoutDerivativeGroupLinear) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (intermediate.getLocalSizeSpecId(0) == TQualifier::layoutNotSet &&
                intermediate.getLocalSizeSpecId(1) == TQualifier::layoutNotSet &&
                intermediate.getLocalSizeSpecId(2) == TQualifier::layoutNotSet &&
                (intermediate.getLocalSize(0) *
                intermediate.getLocalSize(1) *
                intermediate.getLocalSize(2)) % 4 != 0)
                error(loc, "requires total group size to be multiple of four", "derivative_group_linearNV", "");
            else
                intermediate.setLayoutDerivativeMode(LayoutDerivativeGroupLinear);
        }
        else
            error(loc, "can only apply to 'in'", "derivative_group_linearNV", "");
    }
    // Check mesh out array sizes, once all the necessary out qualifiers are defined.
    if ((language == EShLangMesh) &&
        (intermediate.getVertices() != TQualifier::layoutNotSet) &&
        (intermediate.getPrimitives() != TQualifier::layoutNotSet) &&
        (intermediate.getOutputPrimitive() != ElgNone))
    {
        checkIoArraysConsistency(loc);
    }

    if (publicType.shaderQualifiers.layoutPrimitiveCulling) {
        if (publicType.qualifier.storage != EvqTemporary)
            error(loc, "layout qualifier cannot have storage qualifiers", "primitive_culling", "", "");
        else {
            intermediate.setLayoutPrimitiveCulling();
        }
        // Exit early as further checks are not valid
        return;
    }

    const TQualifier& qualifier = publicType.qualifier;

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.precision != EpqNone)
        error(loc, "cannot use auxiliary, memory, interpolation, or precision qualifier in a default qualifier declaration (declaration with no type)", "qualifier", "");

    // "The offset qualifier can only be used on block members of blocks..."
    // "The align qualifier can only be used on blocks or block members..."
    if (qualifier.hasOffset() ||
        qualifier.hasAlign())
        error(loc, "cannot use offset or align qualifiers in a default qualifier declaration (declaration with no type)", "layout qualifier", "");

    layoutQualifierCheck(loc, qualifier);

    switch (qualifier.storage) {
    case EvqUniform:
        if (qualifier.hasMatrix())
            globalUniformDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalUniformDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqBuffer:
        if (qualifier.hasMatrix())
            globalBufferDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalBufferDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqVaryingIn:
        break;
    case EvqVaryingOut:
        if (qualifier.hasStream())
            globalOutputDefaults.layoutStream = qualifier.layoutStream;
        if (qualifier.hasXfbBuffer())
            globalOutputDefaults.layoutXfbBuffer = qualifier.layoutXfbBuffer;
        if (globalOutputDefaults.hasXfbBuffer() && qualifier.hasXfbStride()) {
            if (! intermediate.setXfbBufferStride(globalOutputDefaults.layoutXfbBuffer, qualifier.layoutXfbStride))
                error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d", qualifier.layoutXfbBuffer);
        }
        break;
    case EvqShared:
        if (qualifier.hasMatrix())
            globalSharedDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalSharedDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    default:
        error(loc, "default qualifier requires 'uniform', 'buffer', 'in', 'out' or 'shared' storage qualification", "", "");
        return;
    }

    if (qualifier.hasBinding())
        error(loc, "cannot declare a default, include a type or full declaration", "binding", "");
    if (qualifier.hasAnyLocation())
        error(loc, "cannot declare a default, use a full declaration", "location/component/index", "");
    if (qualifier.hasXfbOffset())
        error(loc, "cannot declare a default, use a full declaration", "xfb_offset", "");
    if (qualifier.isPushConstant())
        error(loc, "cannot declare a default, can only be used on a block", "push_constant", "");
    if (qualifier.hasBufferReference())
        error(loc, "cannot declare a default, can only be used on a block", "buffer_reference", "");
    if (qualifier.hasSpecConstantId())
        error(loc, "cannot declare a default, can only be used on a scalar", "constant_id", "");
    if (qualifier.isShaderRecord())
        error(loc, "cannot declare a default, can only be used on a block", "shaderRecordNV", "");
}